

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
          (SmallVectorBase<slang::syntax::TokenOrSyntax> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pTVar3;
  size_t size;
  undefined8 uVar4;
  byte *pbVar5;
  long lVar6;
  bool bVar7;
  
  if (this->len == 0) {
    return 0;
  }
  size = this->len * 0x18;
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  if (*(byte **)(dst + 8) < pbVar5 + size) {
    pbVar5 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar5 + size;
  }
  sVar2 = this->len;
  if (sVar2 != 0) {
    pTVar3 = this->data_;
    lVar6 = 0;
    do {
      *(undefined8 *)(pbVar5 + lVar6 + 0x10) =
           *(undefined8 *)
            ((long)&(pTVar3->super_ConstTokenOrSyntax).
                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                    .
                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
            + lVar6 + 0x10);
      puVar1 = (undefined8 *)
               ((long)&(pTVar3->super_ConstTokenOrSyntax).
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + lVar6);
      uVar4 = puVar1[1];
      *(undefined8 *)(pbVar5 + lVar6) = *puVar1;
      *(undefined8 *)(pbVar5 + lVar6 + 8) = uVar4;
      bVar7 = sVar2 * 0x18 + -0x18 == lVar6;
      if (bVar7) break;
      lVar6 = lVar6 + 0x18;
    } while (!bVar7);
  }
  return (int)pbVar5;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }